

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O3

void __thiscall
efsw::DirWatcherGeneric::DirWatcherGeneric
          (DirWatcherGeneric *this,DirWatcherGeneric *parent,WatcherGeneric *ws,string *directory,
          bool recursive,bool reportNewFiles)

{
  DirectorySnapshot *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  DirectorySnapshotDiff *this_01;
  char *__end;
  pointer filename;
  DirectorySnapshotDiff Diff;
  string local_200;
  string local_1e0;
  DirectorySnapshotDiff local_1c0;
  DirectorySnapshotDiff local_f8;
  
  this->Parent = parent;
  this->Watch = ws;
  this_00 = &this->DirSnap;
  DirectorySnapshot::DirectorySnapshot(this_00);
  p_Var1 = &(this->Directories)._M_t._M_impl.super__Rb_tree_header;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Recursive = recursive;
  this->Deleted = false;
  pcVar2 = (directory->_M_dataplus)._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar2,pcVar2 + directory->_M_string_length);
  resetDirectory(this,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if (reportNewFiles) {
    DirectorySnapshot::scan(&local_1c0,this_00);
    bVar3 = DirectorySnapshotDiff::changed(&local_1c0);
    if ((bVar3) &&
       (local_1c0.FilesCreated.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_1c0.FilesCreated.super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      filename = local_1c0.FilesCreated.
                 super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"","");
        handleAction(this,&filename->Filepath,1,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        filename = filename + 1;
      } while (filename !=
               local_1c0.FilesCreated.
               super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::~vector(&local_1c0.DirsMoved);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_1c0.DirsModified);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_1c0.DirsCreated);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_1c0.DirsDeleted);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::~vector(&local_1c0.FilesMoved);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_1c0.FilesModified);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_1c0.FilesCreated);
    this_01 = &local_1c0;
  }
  else {
    DirectorySnapshot::scan(&local_f8,this_00);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::~vector(&local_f8.DirsMoved);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f8.DirsModified);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f8.DirsCreated);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f8.DirsDeleted);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::~vector(&local_f8.FilesMoved);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f8.FilesModified);
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&local_f8.FilesCreated);
    this_01 = &local_f8;
  }
  std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::~vector(&this_01->FilesDeleted);
  return;
}

Assistant:

DirWatcherGeneric::DirWatcherGeneric( DirWatcherGeneric* parent, WatcherGeneric* ws,
									  const std::string& directory, bool recursive,
									  bool reportNewFiles ) :
	Parent( parent ), Watch( ws ), Recursive( recursive ), Deleted( false ) {
	resetDirectory( directory );

	if ( !reportNewFiles ) {
		DirSnap.scan();
	} else {
		DirectorySnapshotDiff Diff = DirSnap.scan();

		if ( Diff.changed() ) {
			FileInfoList::iterator it;

			DiffIterator( FilesCreated ) {
				handleAction( ( *it ).Filepath, Actions::Add );
			}
		}
	}
}